

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeparser.cpp
# Opt level: O2

Function * __thiscall
stackjit::ByteCodeParser::parseFunctionDefinition
          (Function *__return_storage_ptr__,ByteCodeParser *this,bool isExternal)

{
  bool bVar1;
  runtime_error *this_00;
  string returnType;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parameters;
  string local_90;
  string local_70;
  string name;
  
  nextToken_abi_cxx11_(&name,this);
  nextToken_abi_cxx11_(&returnType,this);
  bVar1 = std::operator!=(&returnType,"(");
  std::__cxx11::string::~string((string *)&returnType);
  if (!bVar1) {
    parameters.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    parameters.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    parameters.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    while( true ) {
      nextToken_abi_cxx11_(&returnType,this);
      bVar1 = std::operator==(&returnType,")");
      if (bVar1) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&parameters,&returnType);
      std::__cxx11::string::~string((string *)&returnType);
    }
    std::__cxx11::string::~string((string *)&returnType);
    nextToken_abi_cxx11_(&returnType,this);
    std::__cxx11::string::string((string *)&local_70,(string *)&name);
    std::__cxx11::string::string((string *)&local_90,(string *)&returnType);
    Loader::Function::Function(__return_storage_ptr__,&local_70,&local_90,&parameters,isExternal);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&returnType);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&parameters);
    std::__cxx11::string::~string((string *)&name);
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Expected \'(\' after function name.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Loader::Function ByteCodeParser::parseFunctionDefinition(bool isExternal) {
		auto name = nextToken();

		if (nextToken() != "(") {
			throw std::runtime_error("Expected '(' after function name.");
		}

		std::vector<std::string> parameters;
		while (true) {
			auto parameter = nextToken();
			if (parameter == ")") {
				break;
			}

			parameters.push_back(parameter);
		}

		auto returnType = nextToken();
		return Loader::Function(name, returnType, parameters, isExternal);
	}